

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  setDocumentLocatorSAXFunc p_Var2;
  startDocumentSAXFunc p_Var3;
  xmlParserInputBufferPtr pxVar4;
  externalSubsetSAXFunc p_Var5;
  xmlChar *pxVar6;
  xmlParserInputPtr pxVar7;
  xmlChar xVar8;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (pxVar7 = ctxt->input, pxVar7 != (xmlParserInputPtr)0x0)) {
    if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlCtxtInitializeLate(ctxt);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var2 = ctxt->sax->setDocumentLocator, p_Var2 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var2)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    pxVar7 = ctxt->input;
    pxVar6 = pxVar7->cur;
    xVar8 = *pxVar6;
    if (xVar8 == '\0') {
      xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
    }
    else {
      if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar6 < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar6 = ctxt->input->cur;
        xVar8 = *pxVar6;
      }
      if ((((((xVar8 == '<') && (pxVar6[1] == '?')) && (pxVar6[2] == 'x')) &&
           ((pxVar6[3] == 'm' && (pxVar6[4] == 'l')))) && ((ulong)pxVar6[5] < 0x21)) &&
         ((0x100002600U >> ((ulong)pxVar6[5] & 0x3f) & 1) != 0)) {
        xmlParseXMLDecl(ctxt);
        xmlSkipBlankChars(ctxt);
      }
      else {
        pxVar6 = xmlCharStrdup("1.0");
        ctxt->version = pxVar6;
        if (pxVar6 == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
          return -1;
        }
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var3 = ctxt->sax->startDocument, p_Var3 != (startDocumentSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var3)(ctxt->userData);
      }
      if ((((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
          (pxVar4 = ctxt->input->buf, pxVar4 != (xmlParserInputBufferPtr)0x0)) &&
         (iVar1 = pxVar4->compressed, -1 < iVar1)) {
        ctxt->myDoc->compression = iVar1;
      }
      xmlParseMisc(ctxt);
      pxVar7 = ctxt->input;
      if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar7 = ctxt->input;
      }
      pxVar6 = pxVar7->cur;
      if (((*pxVar6 == '<') && (pxVar6[1] == '!')) &&
         (((pxVar6[2] == 'D' && (((pxVar6[3] == 'O' && (pxVar6[4] == 'C')) && (pxVar6[5] == 'T'))))
          && (((pxVar6[6] == 'Y' && (pxVar6[7] == 'P')) && (pxVar6[8] == 'E')))))) {
        ctxt->inSubset = 1;
        xmlParseDocTypeDecl(ctxt);
        xVar8 = *ctxt->input->cur;
        if (xVar8 == '>') {
          xmlNextChar(ctxt);
        }
        else if (xVar8 == '[') {
          xmlParseInternalSubset(ctxt);
        }
        ctxt->inSubset = 2;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (p_Var5 = ctxt->sax->externalSubset, p_Var5 != (externalSubsetSAXFunc)0x0)) &&
           (ctxt->disableSAX == 0)) {
          (*p_Var5)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
        }
        ctxt->inSubset = 0;
        xmlCleanSpecialAttr(ctxt);
        xmlParseMisc(ctxt);
        pxVar7 = ctxt->input;
      }
      if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar7 = ctxt->input;
      }
      if (*pxVar7->cur == '<') {
        xmlParseElement(ctxt);
        xmlParseMisc(ctxt);
        xmlParserCheckEOF(ctxt,XML_ERR_DOCUMENT_END);
      }
      else if (ctxt->wellFormed != 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_DOCUMENT_EMPTY,"Start tag expected, \'<\' not found\n");
      }
      ctxt->instate = XML_PARSER_EOF;
      xmlFinishDocument(ctxt);
      if (ctxt->wellFormed != 0) {
        return 0;
      }
      ctxt->valid = 0;
    }
  }
  return -1;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlCtxtInitializeLate(ctxt);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    GROW;
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
        if (ctxt->version == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    xmlParseInternalSubset(ctxt);
	} else if (RAW == '>') {
            NEXT;
        }

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
        if (ctxt->wellFormed)
            xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                           "Start tag expected, '<' not found\n");
    } else {
	xmlParseElement(ctxt);

	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

        xmlParserCheckEOF(ctxt, XML_ERR_DOCUMENT_END);
    }

    ctxt->instate = XML_PARSER_EOF;
    xmlFinishDocument(ctxt);

    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }

    return(0);
}